

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3PagerCommitPhaseOne(Pager *pPager,char *zMaster,int noSync)

{
  int iVar1;
  PgHdr *pList_00;
  int in_EDX;
  Pager *in_RSI;
  Pager *in_RDI;
  Pgno nNew;
  PgHdr *pPageOne;
  PgHdr *pList;
  int rc;
  int in_stack_ffffffffffffffbc;
  Pager *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  Pager *in_stack_ffffffffffffffd0;
  PgHdr *pPVar2;
  Pager *in_stack_ffffffffffffffd8;
  Pgno nPage;
  int iVar3;
  Pager *pPager_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar3 = 0;
  if (in_RDI->errCode != 0) {
    return in_RDI->errCode;
  }
  if (in_RDI->eState < 3) {
    return 0;
  }
  if (in_RDI->memDb == '\0') {
    iVar1 = pagerUseWal(in_RDI);
    if (iVar1 == 0) {
      iVar3 = pager_incr_changecounter(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      pPager_00 = in_RDI;
      if (iVar3 == 0) {
        iVar3 = writeMasterJournal(in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0);
        nPage = (Pgno)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
        pPager_00 = in_RDI;
        if ((iVar3 == 0) && (iVar3 = syncJournal(in_RSI,in_EDX), pPager_00 = in_RDI, iVar3 == 0)) {
          sqlite3PcacheDirtyList((PCache *)in_RDI);
          iVar3 = pager_write_pagelist(pPager_00,(PgHdr *)in_RSI);
          if (iVar3 == 0) {
            sqlite3PcacheCleanAll((PCache *)in_RDI);
            if (pPager_00->dbFileSize < pPager_00->dbSize) {
              in_stack_ffffffffffffffcc =
                   pPager_00->dbSize -
                   (uint)(pPager_00->dbSize == sqlite3PendingByte / pPager_00->pageSize + 1U);
              iVar3 = pager_truncate((Pager *)CONCAT44(in_EDX,iVar3),nPage);
              if (iVar3 != 0) goto LAB_001137e8;
            }
            if (in_EDX == 0) {
              iVar3 = sqlite3PagerSync(in_stack_ffffffffffffffd0,
                                       (char *)CONCAT44(in_stack_ffffffffffffffcc,
                                                        in_stack_ffffffffffffffc8));
            }
          }
        }
      }
    }
    else {
      pList_00 = sqlite3PcacheDirtyList((PCache *)in_stack_ffffffffffffffc0);
      pPVar2 = (PgHdr *)0x0;
      pPager_00 = in_RDI;
      if (pList_00 == (PgHdr *)0x0) {
        iVar3 = sqlite3PagerAcquire((Pager *)CONCAT44(in_stack_fffffffffffffffc,
                                                      in_stack_fffffffffffffff8),
                                    (Pgno)((ulong)in_RDI >> 0x20),(DbPage **)in_RSI,in_EDX);
        pPVar2->pDirty = (PgHdr *)0x0;
        pList_00 = pPVar2;
        pPager_00 = in_RDI;
      }
      if (pList_00 != (PgHdr *)0x0) {
        iVar3 = pagerWalFrames((Pager *)CONCAT44(in_EDX,iVar3),pList_00,
                               (Pgno)((ulong)pPVar2 >> 0x20),(int)pPVar2);
      }
      sqlite3PagerUnref((DbPage *)0x11369c);
      if (iVar3 == 0) {
        sqlite3PcacheCleanAll((PCache *)in_stack_ffffffffffffffc0);
      }
    }
  }
  else {
    sqlite3BackupRestart(in_RDI->pBackup);
    pPager_00 = in_RDI;
  }
LAB_001137e8:
  if ((iVar3 == 0) && (iVar1 = pagerUseWal(pPager_00), iVar1 == 0)) {
    pPager_00->eState = '\x05';
  }
  return iVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerCommitPhaseOne(
  Pager *pPager,                  /* Pager object */
  const char *zMaster,            /* If not NULL, the master journal name */
  int noSync                      /* True to omit the xSync on the db file */
){
  int rc = SQLITE_OK;             /* Return code */

  assert( pPager->eState==PAGER_WRITER_LOCKED
       || pPager->eState==PAGER_WRITER_CACHEMOD
       || pPager->eState==PAGER_WRITER_DBMOD
       || pPager->eState==PAGER_ERROR
  );
  assert( assert_pager_state(pPager) );

  /* If a prior error occurred, report that error again. */
  if( NEVER(pPager->errCode) ) return pPager->errCode;

  PAGERTRACE(("DATABASE SYNC: File=%s zMaster=%s nSize=%d\n", 
      pPager->zFilename, zMaster, pPager->dbSize));

  /* If no database changes have been made, return early. */
  if( pPager->eState<PAGER_WRITER_CACHEMOD ) return SQLITE_OK;

  if( MEMDB ){
    /* If this is an in-memory db, or no pages have been written to, or this
    ** function has already been called, it is mostly a no-op.  However, any
    ** backup in progress needs to be restarted.
    */
    sqlite3BackupRestart(pPager->pBackup);
  }else{
    if( pagerUseWal(pPager) ){
      PgHdr *pList = sqlite3PcacheDirtyList(pPager->pPCache);
      PgHdr *pPageOne = 0;
      if( pList==0 ){
        /* Must have at least one page for the WAL commit flag.
        ** Ticket [2d1a5c67dfc2363e44f29d9bbd57f] 2011-05-18 */
        rc = sqlite3PagerGet(pPager, 1, &pPageOne);
        pList = pPageOne;
        pList->pDirty = 0;
      }
      assert( rc==SQLITE_OK );
      if( ALWAYS(pList) ){
        rc = pagerWalFrames(pPager, pList, pPager->dbSize, 1);
      }
      sqlite3PagerUnref(pPageOne);
      if( rc==SQLITE_OK ){
        sqlite3PcacheCleanAll(pPager->pPCache);
      }
    }else{
      /* The following block updates the change-counter. Exactly how it
      ** does this depends on whether or not the atomic-update optimization
      ** was enabled at compile time, and if this transaction meets the 
      ** runtime criteria to use the operation: 
      **
      **    * The file-system supports the atomic-write property for
      **      blocks of size page-size, and 
      **    * This commit is not part of a multi-file transaction, and
      **    * Exactly one page has been modified and store in the journal file.
      **
      ** If the optimization was not enabled at compile time, then the
      ** pager_incr_changecounter() function is called to update the change
      ** counter in 'indirect-mode'. If the optimization is compiled in but
      ** is not applicable to this transaction, call sqlite3JournalCreate()
      ** to make sure the journal file has actually been created, then call
      ** pager_incr_changecounter() to update the change-counter in indirect
      ** mode. 
      **
      ** Otherwise, if the optimization is both enabled and applicable,
      ** then call pager_incr_changecounter() to update the change-counter
      ** in 'direct' mode. In this case the journal file will never be
      ** created for this transaction.
      */
  #ifdef SQLITE_ENABLE_ATOMIC_WRITE
      PgHdr *pPg;
      assert( isOpen(pPager->jfd) 
           || pPager->journalMode==PAGER_JOURNALMODE_OFF 
           || pPager->journalMode==PAGER_JOURNALMODE_WAL 
      );
      if( !zMaster && isOpen(pPager->jfd) 
       && pPager->journalOff==jrnlBufferSize(pPager) 
       && pPager->dbSize>=pPager->dbOrigSize
       && (0==(pPg = sqlite3PcacheDirtyList(pPager->pPCache)) || 0==pPg->pDirty)
      ){
        /* Update the db file change counter via the direct-write method. The 
        ** following call will modify the in-memory representation of page 1 
        ** to include the updated change counter and then write page 1 
        ** directly to the database file. Because of the atomic-write 
        ** property of the host file-system, this is safe.
        */
        rc = pager_incr_changecounter(pPager, 1);
      }else{
        rc = sqlite3JournalCreate(pPager->jfd);
        if( rc==SQLITE_OK ){
          rc = pager_incr_changecounter(pPager, 0);
        }
      }
  #else
      rc = pager_incr_changecounter(pPager, 0);
  #endif
      if( rc!=SQLITE_OK ) goto commit_phase_one_exit;
  
      /* Write the master journal name into the journal file. If a master 
      ** journal file name has already been written to the journal file, 
      ** or if zMaster is NULL (no master journal), then this call is a no-op.
      */
      rc = writeMasterJournal(pPager, zMaster);
      if( rc!=SQLITE_OK ) goto commit_phase_one_exit;
  
      /* Sync the journal file and write all dirty pages to the database.
      ** If the atomic-update optimization is being used, this sync will not 
      ** create the journal file or perform any real IO.
      **
      ** Because the change-counter page was just modified, unless the
      ** atomic-update optimization is used it is almost certain that the
      ** journal requires a sync here. However, in locking_mode=exclusive
      ** on a system under memory pressure it is just possible that this is 
      ** not the case. In this case it is likely enough that the redundant
      ** xSync() call will be changed to a no-op by the OS anyhow. 
      */
      rc = syncJournal(pPager, 0);
      if( rc!=SQLITE_OK ) goto commit_phase_one_exit;
  
      rc = pager_write_pagelist(pPager,sqlite3PcacheDirtyList(pPager->pPCache));
      if( rc!=SQLITE_OK ){
        assert( rc!=SQLITE_IOERR_BLOCKED );
        goto commit_phase_one_exit;
      }
      sqlite3PcacheCleanAll(pPager->pPCache);

      /* If the file on disk is smaller than the database image, use 
      ** pager_truncate to grow the file here. This can happen if the database
      ** image was extended as part of the current transaction and then the
      ** last page in the db image moved to the free-list. In this case the
      ** last page is never written out to disk, leaving the database file
      ** undersized. Fix this now if it is the case.  */
      if( pPager->dbSize>pPager->dbFileSize ){
        Pgno nNew = pPager->dbSize - (pPager->dbSize==PAGER_MJ_PGNO(pPager));
        assert( pPager->eState==PAGER_WRITER_DBMOD );
        rc = pager_truncate(pPager, nNew);
        if( rc!=SQLITE_OK ) goto commit_phase_one_exit;
      }
  
      /* Finally, sync the database file. */
      if( !noSync ){
        rc = sqlite3PagerSync(pPager, zMaster);
      }
      IOTRACE(("DBSYNC %p\n", pPager))
    }
  }

commit_phase_one_exit:
  if( rc==SQLITE_OK && !pagerUseWal(pPager) ){
    pPager->eState = PAGER_WRITER_FINISHED;
  }
  return rc;
}